

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

int __thiscall
kj::anon_unknown_0::ConnectCancelReadService::connect
          (ConnectCancelReadService *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined4 in_register_00000034;
  undefined8 *in_stack_00000008;
  HttpHeaders HStack_78;
  
  HttpHeaders::HttpHeaders
            (&HStack_78,*(HttpHeaderTable **)(CONCAT44(in_register_00000034,__fd) + 8));
  (**(code **)*in_stack_00000008)(in_stack_00000008,200,"OK",3,&HStack_78);
  HttpHeaders::~HttpHeaders(&HStack_78);
  kj::_::readyNow();
  return (int)this;
}

Assistant:

kj::Promise<void> connect(kj::StringPtr host,
                            const HttpHeaders& headers,
                            kj::AsyncIoStream& connection,
                            ConnectResponse& response,
                            kj::HttpConnectSettings settings) override {
    response.accept(200, "OK", HttpHeaders(headerTable));
    // Return an immediately resolved promise and drop the connection
    return kj::READY_NOW;
  }